

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

char * GetModuleMainName(Allocator *allocator,InplaceStr moduleName)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint local_34;
  uint i;
  char *targetName;
  uint length;
  Allocator *allocator_local;
  InplaceStr moduleName_local;
  char *dst;
  
  moduleName_local.begin = moduleName.end;
  allocator_local = (Allocator *)moduleName.begin;
  uVar1 = InplaceStr::length((InplaceStr *)&allocator_local);
  uVar1 = uVar1 + 8;
  iVar2 = (*allocator->_vptr_Allocator[2])(allocator,(ulong)uVar1);
  dst = (char *)CONCAT44(extraout_var,iVar2);
  NULLC::SafeSprintf(dst,(ulong)uVar1,"__init_%.*s",
                     (ulong)(uint)((int)moduleName_local.begin - (int)allocator_local),
                     allocator_local);
  for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
    if ((dst[local_34] == '/') || (dst[local_34] == '.')) {
      dst[local_34] = '_';
    }
  }
  return dst;
}

Assistant:

const char* GetModuleMainName(Allocator *allocator, InplaceStr moduleName)
{
	unsigned length = unsigned(moduleName.length() + + strlen("__init_") + 1);
	char *targetName = (char*)allocator->alloc(length);

	NULLC::SafeSprintf(targetName, length, "__init_%.*s", FMT_ISTR(moduleName));

	for(unsigned i = 0; i < length; i++)
	{
		if(targetName[i] == '/' || targetName[i] == '.')
			targetName[i] = '_';
	}

	return targetName;
}